

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_date_scanfn(arg_date *parent,char *argval)

{
  int iVar1;
  undefined1 local_60 [8];
  tm tm;
  char *pend;
  int errorcode;
  char *argval_local;
  arg_date *parent_local;
  
  pend._4_4_ = 0;
  if (parent->count == (parent->hdr).maxcount) {
    pend._4_4_ = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    memcpy(local_60,parent->tmval + parent->count,0x38);
    tm.tm_zone = arg_strptime(argval,parent->format,(tm *)local_60);
    if ((tm.tm_zone == (char *)0x0) || (*tm.tm_zone != '\0')) {
      pend._4_4_ = 6;
    }
    else {
      iVar1 = parent->count;
      parent->count = iVar1 + 1;
      memcpy(parent->tmval + iVar1,local_60,0x38);
    }
  }
  return pend._4_4_;
}

Assistant:

static int arg_date_scanfn(struct arg_date * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* no argument value was given, leave parent->tmval[] unaltered but still count it */
		parent->count++;
	} else {
		const char * pend;
		struct tm tm = parent->tmval[parent->count];

		/* parse the given argument value, store result in parent->tmval[] */
		pend = arg_strptime(argval, parent->format, &tm);

		if (pend && pend[0] == '\0') {
			parent->tmval[parent->count++] = tm;
		} else {
			errorcode = EBADDATE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}